

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_DimStyle::TextPositionPropertiesHash(ON_SHA1_Hash *__return_storage_ptr__,ON_DimStyle *this)

{
  bool bVar1;
  LengthUnitSystem LVar2;
  double dVar3;
  ON_SHA1_Hash *local_d8;
  ON_SHA1_Hash local_b8;
  undefined1 local_a4 [8];
  ON_SHA1_Hash font_hash;
  ON_SHA1 sha1;
  ON_DimStyle *this_local;
  
  bVar1 = ON_SHA1_Hash::IsEmptyContentHash(&this->m_text_position_properties_hash);
  if (bVar1) {
    ON_SHA1::ON_SHA1((ON_SHA1 *)(font_hash.m_digest + 0xc));
    if (this->m_managed_font == (ON_Font *)0x0) {
      local_d8 = ON_Font::FontCharacteristicsHash(&this->m_font_characteristics);
    }
    else {
      local_d8 = ON_Font::FontCharacteristicsHash(this->m_managed_font);
    }
    local_a4 = *(undefined1 (*) [8])local_d8->m_digest;
    font_hash.m_digest._0_8_ = *(undefined8 *)(local_d8->m_digest + 8);
    font_hash.m_digest._8_4_ = *(undefined4 *)(local_d8->m_digest + 0x10);
    ON_SHA1::AccumulateSubHash((ON_SHA1 *)(font_hash.m_digest + 0xc),(ON_SHA1_Hash *)local_a4);
    dVar3 = DimScale(this);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),dVar3);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_extextension);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_extoffset);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_textheight);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_dim_text_location);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_dimradial_text_location);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_angleformat);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_dimension_length_display);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_alternate_dimension_length_display);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_angleresolution);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_lengthresolution);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_lengthfactor);
    ON_SHA1::AccumulateBool((ON_SHA1 *)(font_hash.m_digest + 0xc),(bool)(this->m_bAlternate & 1));
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_alternate_lengthfactor);
    ON_SHA1::AccumulateInteger32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_alternate_lengthresolution);
    ON_wString::IsValid(&this->m_prefix,true);
    ON_SHA1::AccumulateString((ON_SHA1 *)(font_hash.m_digest + 0xc),&this->m_prefix);
    ON_wString::IsValid(&this->m_suffix,true);
    ON_SHA1::AccumulateString((ON_SHA1 *)(font_hash.m_digest + 0xc),&this->m_suffix);
    ON_wString::IsValid(&this->m_alternate_prefix,true);
    ON_SHA1::AccumulateString((ON_SHA1 *)(font_hash.m_digest + 0xc),&this->m_alternate_prefix);
    ON_wString::IsValid(&this->m_alternate_suffix,true);
    ON_SHA1::AccumulateString((ON_SHA1 *)(font_hash.m_digest + 0xc),&this->m_alternate_suffix);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_dimextension);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_tolerance_format);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_tolerance_resolution)
    ;
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_tolerance_upper_value);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_tolerance_lower_value);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_tolerance_height_scale);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_text_rotation);
    ON_SHA1::AccumulateInteger32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_alternate_tolerance_resolution);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_tol_textheight_fraction)
    ;
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_textmove_leader);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_arclength_sym);
    ON_SHA1::AccumulateDouble
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_stack_textheight_fraction);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_stack_format);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_alt_round);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_round);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_angular_round);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_alt_zero_suppress);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_zero_suppress)
    ;
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_ang_zero_suppress);
    ON_SHA1::AccumulateBool((ON_SHA1 *)(font_hash.m_digest + 0xc),(bool)(this->m_alt_below & 1));
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_text_vertical_alignment);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_text_horizontal_alignment);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_leader_text_vertical_alignment);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_leader_text_horizontal_alignment)
    ;
    dVar3 = ON_ScaleValue::LeftToRightScale(&this->m_scale_value);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(font_hash.m_digest + 0xc),dVar3);
    LVar2 = UnitSystem(this);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)LVar2);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_text_orientation);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_leader_text_orientation);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_dim_text_orientation);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_dimradial_text_orientation);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_dim_text_angle_style);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_dimradial_text_angle_style);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)(this->m_text_underlined & 1));
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_ArrowFit);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(font_hash.m_digest + 0xc),(uint)this->m_TextFit);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(font_hash.m_digest + 0xc),this->m_decimal_separator);
    ON_SHA1::Hash(&local_b8,(ON_SHA1 *)(font_hash.m_digest + 0xc));
    *(undefined8 *)(this->m_text_position_properties_hash).m_digest = local_b8.m_digest._0_8_;
    *(undefined8 *)((this->m_text_position_properties_hash).m_digest + 8) = local_b8.m_digest._8_8_;
    *(undefined4 *)((this->m_text_position_properties_hash).m_digest + 0x10) =
         local_b8.m_digest._16_4_;
  }
  *(undefined8 *)__return_storage_ptr__->m_digest =
       *(undefined8 *)(this->m_text_position_properties_hash).m_digest;
  *(undefined8 *)(__return_storage_ptr__->m_digest + 8) =
       *(undefined8 *)((this->m_text_position_properties_hash).m_digest + 8);
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
       *(undefined4 *)((this->m_text_position_properties_hash).m_digest + 0x10);
  return __return_storage_ptr__;
}

Assistant:

const class ON_SHA1_Hash ON_DimStyle::TextPositionPropertiesHash() const
{
  // sha1 hash of properties that have any possible effect on annotation text appearance, size, shape
  if (m_text_position_properties_hash.IsEmptyContentHash())
  {
    ON_SHA1 sha1;
    
    const ON_SHA1_Hash font_hash
      = nullptr != m_managed_font
      ? m_managed_font->FontCharacteristicsHash()
      : m_font_characteristics.FontCharacteristicsHash();
    sha1.AccumulateSubHash(font_hash);
    sha1.AccumulateDouble(DimScale());
    sha1.AccumulateDouble(m_extextension);
    sha1.AccumulateDouble(m_extoffset);
    sha1.AccumulateDouble(m_textheight);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dim_text_location));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dimradial_text_location));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_angleformat));

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dimension_length_display));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_alternate_dimension_length_display));

    sha1.AccumulateInteger32(m_angleresolution);
    sha1.AccumulateInteger32(m_lengthresolution);
    sha1.AccumulateDouble(m_lengthfactor);
    sha1.AccumulateBool(m_bAlternate);
    sha1.AccumulateDouble(m_alternate_lengthfactor);
    sha1.AccumulateInteger32(m_alternate_lengthresolution);

    m_prefix.IsValid(true);
    sha1.AccumulateString(m_prefix);

    m_suffix.IsValid(true);
    sha1.AccumulateString(m_suffix);

    m_alternate_prefix.IsValid(true);
    sha1.AccumulateString(m_alternate_prefix);

    m_alternate_suffix.IsValid(true);
    sha1.AccumulateString(m_alternate_suffix);

    sha1.AccumulateDouble(m_dimextension);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_tolerance_format));
    sha1.AccumulateInteger32(m_tolerance_resolution);
    sha1.AccumulateDouble(m_tolerance_upper_value);
    sha1.AccumulateDouble(m_tolerance_lower_value);
    sha1.AccumulateDouble(m_tolerance_height_scale);
    sha1.AccumulateDouble(m_text_rotation);
    sha1.AccumulateInteger32(m_alternate_tolerance_resolution);
    sha1.AccumulateDouble(m_tol_textheight_fraction);
    sha1.AccumulateInteger32(m_textmove_leader);
    sha1.AccumulateInteger32(m_arclength_sym);
    sha1.AccumulateDouble(m_stack_textheight_fraction);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_stack_format));
    sha1.AccumulateDouble(m_alt_round);
    sha1.AccumulateDouble(m_round);
    sha1.AccumulateDouble(m_angular_round);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_alt_zero_suppress));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_zero_suppress));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_ang_zero_suppress));
    sha1.AccumulateBool(m_alt_below);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_text_vertical_alignment));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_text_horizontal_alignment));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_text_vertical_alignment));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_text_horizontal_alignment));
    sha1.AccumulateDouble(m_scale_value.LeftToRightScale());

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(this->UnitSystem()));

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_text_orientation));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_text_orientation));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dim_text_orientation));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dimradial_text_orientation));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dim_text_angle_style));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dimradial_text_angle_style));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_text_underlined));
    
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_ArrowFit));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_TextFit));

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_decimal_separator));

    // Save hash in mutable m_text_position_properties_hash
    m_text_position_properties_hash = sha1.Hash();
  }
  return m_text_position_properties_hash;
}